

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# single_list.c
# Opt level: O2

unsigned_long list_pop(list_s *lst)

{
  unsigned_long uVar1;
  list_node_s *__ptr;
  _list_node_s *p_Var2;
  
  if ((lst == (list_s *)0x0) || (__ptr = lst->tail, __ptr == (list_node_s *)0x0)) {
    uVar1 = 0;
  }
  else {
    uVar1 = __ptr->value;
    if (lst->head == __ptr) {
      if (__ptr->key != (uchar *)0x0) {
        free(__ptr->key);
        __ptr = lst->tail;
        __ptr->key = (uchar *)0x0;
      }
      free(__ptr);
      lst->head = (list_node_s *)0x0;
      p_Var2 = (_list_node_s *)0x0;
    }
    else {
      p_Var2 = __ptr->next;
      if (__ptr->key != (uchar *)0x0) {
        free(__ptr->key);
        __ptr = lst->tail;
        __ptr->key = (uchar *)0x0;
      }
      free(__ptr);
    }
    lst->tail = p_Var2;
    lst->elements = lst->elements - 1;
  }
  return uVar1;
}

Assistant:

unsigned long list_pop(list_s *lst) {
    if (lst == NULL || lst->tail == NULL) {
        return 0;
    } else {
        unsigned long value = lst->tail->value;
        if (lst->head == lst->tail) { //if head = tail
            if (lst->tail->key != NULL) {
                free(lst->tail->key); //free key memory
                lst->tail->key = NULL; //set list_s key pointer to NULL
            }
            free(lst->tail); //free list_s element memory
            lst->head = NULL; //set list_s pointer to NULL
            lst->tail = NULL; //set list_s pointer to NULL
        } else {
            list_node_s *next = lst->tail->next;
            if (lst->tail->key != NULL) {
                free(lst->tail->key); //free key memory
                lst->tail->key = NULL; //set list_s key pointer to NULL
            }
            free(lst->tail);
            lst->tail = next;
        }
        --lst->elements;
        return value;
    }
}